

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

ByteData *
cfd::core::CalculateRangeProof
          (ByteData *__return_storage_ptr__,uint64_t value,Pubkey *pubkey,Privkey *privkey,
          ConfidentialAssetId *asset,vector<unsigned_char,_std::allocator<unsigned_char>_> *abf,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vbf,Script *script,
          int64_t minimum_range_value,int exponent,int minimum_bits,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *range_proof)

{
  uchar *puVar1;
  uchar *bytes_out;
  bool bVar2;
  uchar *puVar3;
  ScriptOperator *this;
  ByteData *extraout_RAX;
  ByteData *extraout_RAX_00;
  ByteData *extraout_RAX_01;
  ByteData *extraout_RAX_02;
  ByteData *extraout_RAX_03;
  ByteData *pBVar4;
  CfdException *pCVar5;
  value_type_conflict *__val;
  int ret;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  uint64_t local_100;
  uchar *local_f8;
  uchar *local_f0;
  size_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  ByteData *local_b0;
  uint64_t local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  uchar *local_70;
  uchar *local_68;
  ByteData local_60;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_48;
  
  local_100 = value;
  puVar3 = (uchar *)operator_new(0x21);
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + 0x21;
  puVar3[0] = '\0';
  puVar3[1] = '\0';
  puVar3[2] = '\0';
  puVar3[3] = '\0';
  puVar3[4] = '\0';
  puVar3[5] = '\0';
  puVar3[6] = '\0';
  puVar3[7] = '\0';
  puVar3[8] = '\0';
  puVar3[9] = '\0';
  puVar3[10] = '\0';
  puVar3[0xb] = '\0';
  puVar3[0xc] = '\0';
  puVar3[0xd] = '\0';
  puVar3[0xe] = '\0';
  puVar3[0xf] = '\0';
  puVar3[0x10] = '\0';
  puVar3[0x11] = '\0';
  puVar3[0x12] = '\0';
  puVar3[0x13] = '\0';
  puVar3[0x14] = '\0';
  puVar3[0x15] = '\0';
  puVar3[0x16] = '\0';
  puVar3[0x17] = '\0';
  puVar3[0x18] = '\0';
  puVar3[0x19] = '\0';
  puVar3[0x1a] = '\0';
  puVar3[0x1b] = '\0';
  puVar3[0x1c] = '\0';
  puVar3[0x1d] = '\0';
  puVar3[0x1e] = '\0';
  puVar3[0x1f] = '\0';
  puVar3[0x20] = '\0';
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar3;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ConfidentialAssetId::GetUnblindedData((ByteData *)local_120,asset);
  ByteData::GetBytes(&local_c8,(ByteData *)local_120);
  if ((uchar *)local_120._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity - local_120._0_8_);
  }
  puVar1 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_f0 = puVar3;
  ret = wally_asset_generator_from_bytes
                  (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,puVar1,
                   (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,puVar3,0x21);
  if (ret != 0) {
    local_120._0_8_ = "cfdcore_elements_transaction.cpp";
    local_120._8_4_ = 0x7f;
    local_110._M_allocated_capacity = 0x6dacab;
    logger::log<int&>((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                      "wally_asset_generator_from_bytes NG[{}].",&ret);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = &local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"output asset generator error.","");
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_120);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(commitment,0x21);
  puVar3 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  ret = wally_asset_value_commitment
                  (local_100,puVar3,
                   (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,local_f0,0x21,
                   puVar1,(long)(commitment->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  if (ret != 0) {
    local_120._0_8_ = "cfdcore_elements_transaction.cpp";
    local_120._8_4_ = 0x88;
    local_110._M_allocated_capacity = 0x6dacab;
    logger::log<int&>((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                      "wally_asset_value_commitment NG[{}].",&ret);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120._0_8_ = &local_110;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"calc asset commitment error.","");
    CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_120);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(range_proof,0x140e);
  size = 0;
  Privkey::GetData((ByteData *)local_120,privkey);
  ByteData::GetBytes(&local_a0,(ByteData *)local_120);
  if ((uchar *)local_120._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity - local_120._0_8_);
  }
  Script::GetData((ByteData *)local_120,script);
  ByteData::GetBytes(&local_e0,(ByteData *)local_120);
  if ((uchar *)local_120._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity - local_120._0_8_);
  }
  Script::GetElementList(&local_48,script);
  if (local_48.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this = ScriptElement::GetOpCode
                     (local_48.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar2 = ScriptOperator::operator==(this,(ScriptOperator *)ScriptOperator::OP_RETURN);
    if ((!bVar2) &&
       ((ulong)((long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x2711)) {
      if (local_100 == 0) {
        local_120._0_8_ = "cfdcore_elements_transaction.cpp";
        local_120._8_4_ = 0x9b;
        local_110._M_allocated_capacity = 0x6dacab;
        logger::log<>((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                      "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                     );
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_120._0_8_ = &local_110;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,
                   "Amount is 0. Cannot specify 0 for amount if there is a valid confidential address."
                   ,"");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_120);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (local_100 < (ulong)minimum_range_value) {
        local_120._0_8_ = "cfdcore_elements_transaction.cpp";
        local_120._8_4_ = 0xa5;
        local_110._M_allocated_capacity = 0x6dacab;
        logger::log<>((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                      "amount less than minimumRangeValue");
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_120._0_8_ = &local_110;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"The amount is less than the minimumRangeValue.","");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_120);
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_004b6e0b;
    }
  }
  minimum_range_value = 0;
LAB_004b6e0b:
  local_b0 = __return_storage_ptr__;
  local_a8 = minimum_range_value;
  if (pubkey == (Pubkey *)0x0) {
    puVar3 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_f8 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    puVar1 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
             .super__Vector_impl_data._M_start;
    bytes_out = (range_proof->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_start;
    ret = wally_asset_rangeproof_with_nonce
                    (local_100,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,puVar3,
                     (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,local_f8,
                     (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_f8,puVar1,
                     (long)(commitment->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar1,
                     local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,local_f0,0x21,minimum_range_value,
                     exponent,minimum_bits,bytes_out,
                     (long)(range_proof->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)bytes_out,&size);
  }
  else {
    Pubkey::GetData(&local_60,pubkey);
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_120,&local_60)
    ;
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_f8 = (abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_68 = (vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    local_70 = (commitment->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (range_proof->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
             _M_impl.super__Vector_impl_data._M_start;
    ret = wally_asset_rangeproof
                    (local_100,(uchar *)local_120._0_8_,
                     CONCAT44(local_120._12_4_,local_120._8_4_) - local_120._0_8_,
                     local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_a0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                     local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,local_f8,
                     (long)(abf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_f8,local_68,
                     (long)(vbf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_68,local_70,
                     (long)(commitment->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)local_70,
                     local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_e0.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,local_f0,0x21,local_a8,exponent,
                     minimum_bits,puVar3,
                     (long)(range_proof->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,&size);
    __return_storage_ptr__ = local_b0;
    if ((uchar *)local_120._0_8_ != (uchar *)0x0) {
      operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity - local_120._0_8_);
    }
  }
  if (ret == 0) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(range_proof,size);
    ByteData::ByteData(__return_storage_ptr__,&local_88);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_48);
    pBVar4 = extraout_RAX;
    if (local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_e0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pBVar4 = extraout_RAX_00;
    }
    if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pBVar4 = extraout_RAX_01;
    }
    if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pBVar4 = extraout_RAX_02;
    }
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      pBVar4 = extraout_RAX_03;
    }
    return pBVar4;
  }
  local_120._0_8_ = "cfdcore_elements_transaction.cpp";
  local_120._8_4_ = 0xbf;
  local_110._M_allocated_capacity = 0x6dacab;
  logger::log<int&>((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                    "wally_asset_rangeproof NG[{}].",&ret);
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_120._0_8_ = &local_110;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_120,"calc asset rangeproof error.","");
  CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_120);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

static ByteData CalculateRangeProof(
    const uint64_t value, const Pubkey *pubkey, const Privkey &privkey,
    const ConfidentialAssetId &asset, const std::vector<uint8_t> &abf,
    const std::vector<uint8_t> &vbf, const Script &script,
    int64_t minimum_range_value, int exponent, int minimum_bits,
    std::vector<uint8_t> *commitment, std::vector<uint8_t> *range_proof) {
  std::vector<uint8_t> generator(ASSET_GENERATOR_LEN);
  const std::vector<uint8_t> &asset_bytes =
      asset.GetUnblindedData().GetBytes();
  int ret = wally_asset_generator_from_bytes(
      asset_bytes.data(), asset_bytes.size(), abf.data(), abf.size(),
      generator.data(), generator.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_generator_from_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "output asset generator error.");
  }

  commitment->resize(ASSET_COMMITMENT_LEN);
  ret = wally_asset_value_commitment(
      value, vbf.data(), vbf.size(), generator.data(), generator.size(),
      commitment->data(), commitment->size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_value_commitment NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset commitment error.");
  }
  // info(
  //    CFD_LOG_SOURCE, "generator=[{}] commitment=[{}]",
  //    ByteData(generator).GetHex(), ByteData(commitment).GetHex());

  range_proof->resize(ASSET_RANGEPROOF_MAX_LEN);
  size_t size = 0;
  const std::vector<uint8_t> &privkey_byte = privkey.GetData().GetBytes();
  const std::vector<uint8_t> &script_byte = script.GetData().GetBytes();
  const std::vector<ScriptElement> &script_item = script.GetElementList();
  int64_t min_range_value = minimum_range_value;
  if (script_item.empty() ||
      (script_item[0].GetOpCode() == ScriptOperator::OP_RETURN) ||
      (script_byte.size() > Script::kMaxScriptSize)) {
    min_range_value = 0;
  } else if (value == 0) {
    warn(
        CFD_LOG_SOURCE,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
    throw CfdException(
        kCfdIllegalArgumentError,
        "Amount is 0. Cannot specify 0 for amount "
        "if there is a valid confidential address.");  // NOLINT
  }

  if (value < static_cast<uint64_t>(min_range_value)) {
    warn(CFD_LOG_SOURCE, "amount less than minimumRangeValue");
    throw CfdException(
        kCfdIllegalArgumentError,
        "The amount is less than the minimumRangeValue.");
  }

  if (pubkey == nullptr) {
    ret = wally_asset_rangeproof_with_nonce(
        value, privkey_byte.data(), privkey_byte.size(), asset_bytes.data(),
        asset_bytes.size(), abf.data(), abf.size(), vbf.data(), vbf.size(),
        commitment->data(), commitment->size(), script_byte.data(),
        script_byte.size(), generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  } else {
    const std::vector<uint8_t> &pubkey_byte = pubkey->GetData().GetBytes();
    ret = wally_asset_rangeproof(
        value, pubkey_byte.data(), pubkey_byte.size(), privkey_byte.data(),
        privkey_byte.size(), asset_bytes.data(), asset_bytes.size(),
        abf.data(), abf.size(), vbf.data(), vbf.size(), commitment->data(),
        commitment->size(), script_byte.data(), script_byte.size(),
        generator.data(), generator.size(),
        static_cast<uint64_t>(min_range_value), exponent, minimum_bits,
        range_proof->data(), range_proof->size(), &size);
  }
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_rangeproof NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "calc asset rangeproof error.");
  }
  range_proof->resize(size);
  return ByteData(generator);
}